

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Padding_x86_avx::forward_int8
          (Padding_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 uVar1;
  int iVar2;
  _func_int **pp_Var3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int _c;
  ulong uVar7;
  int iVar8;
  long lVar9;
  undefined8 *puVar10;
  int x;
  int iVar11;
  int iVar12;
  _func_int *p_Var13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  int iVar16;
  int iVar17;
  undefined8 *puVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  bool bVar26;
  Mat bottom_blob_unpacked;
  Mat m;
  Mat local_78;
  
  iVar2 = bottom_blob->elempack;
  if ((iVar2 == 8) && (bottom_blob->dims - 1U < 4)) {
    iVar20 = bottom_blob->w;
    iVar24 = bottom_blob->h;
    _c = bottom_blob->c;
    uVar4 = bottom_blob->elemsize;
    switch(bottom_blob->dims) {
    case 1:
      p_Var13 = this->_vptr_Padding_x86_avx[-3];
      uVar19 = *(uint *)(&this->field_0xd8 + (long)p_Var13) + iVar20 * 8 +
               *(int *)(&this->field_0xdc + (long)p_Var13);
      bVar26 = (uVar19 & 7) == 0;
      if ((bVar26 && (*(uint *)(&this->field_0xd8 + (long)p_Var13) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var13) == 0)) {
        Mat::create(top_blob,(int)uVar19 >> 3,(uVar4 >> 3) << bVar26 * '\x03',8,opt->blob_allocator)
        ;
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        p_Var13 = this->_vptr_Padding_x86_avx[-3];
        uVar4 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var13);
        padding_constant_pack8_int8_sse
                  (bottom_blob,top_blob,0,0,*(int *)(&this->field_0xd8 + (long)p_Var13) / 8,
                   *(int *)(&this->field_0xdc + (long)p_Var13) / 8,
                   uVar4 << 0x38 | uVar4 << 0x30 | uVar4 << 0x28 |
                   uVar4 << 0x20 | uVar4 << 0x18 | uVar4 << 0x10 | uVar4 << 8 | uVar4);
        return 0;
      }
      break;
    case 2:
      p_Var13 = this->_vptr_Padding_x86_avx[-3];
      uVar19 = *(uint *)(&this->field_0xd0 + (long)p_Var13) + iVar24 * 8 +
               *(int *)(&this->field_0xd4 + (long)p_Var13);
      bVar26 = (uVar19 & 7) == 0;
      if ((bVar26 && (*(uint *)(&this->field_0xd0 + (long)p_Var13) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var13) == 0)) {
        Mat::create(top_blob,iVar20 + *(int *)(&this->field_0xd8 + (long)p_Var13) +
                             *(int *)(&this->field_0xdc + (long)p_Var13),(int)uVar19 >> 3,
                    (uVar4 >> 3) << bVar26 * '\x03',8,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        p_Var13 = this->_vptr_Padding_x86_avx[-3];
        uVar4 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var13);
        padding_constant_pack8_int8_sse
                  (bottom_blob,top_blob,*(int *)(&this->field_0xd0 + (long)p_Var13) / 8,
                   *(int *)(&this->field_0xd4 + (long)p_Var13) / 8,
                   *(int *)(&this->field_0xd8 + (long)p_Var13),
                   *(int *)(&this->field_0xdc + (long)p_Var13),
                   uVar4 << 0x38 | uVar4 << 0x30 | uVar4 << 0x28 |
                   uVar4 << 0x20 | uVar4 << 0x18 | uVar4 << 0x10 | uVar4 << 8 | uVar4);
        return 0;
      }
      break;
    case 3:
      p_Var13 = this->_vptr_Padding_x86_avx[-3];
      uVar19 = *(uint *)(&this->field_0xe8 + (long)p_Var13) + _c * 8 +
               *(int *)(&this->field_0xec + (long)p_Var13);
      bVar26 = (uVar19 & 7) == 0;
      if (bVar26 && (*(uint *)(&this->field_0xe8 + (long)p_Var13) & 7) == 0) {
        if ((uVar19 == _c * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var13) == 0)) {
          iVar2 = (int)uVar19 >> 3;
          Mat::create(top_blob,iVar20 + *(int *)(&this->field_0xd8 + (long)p_Var13) +
                               *(int *)(&this->field_0xdc + (long)p_Var13),
                      iVar24 + *(int *)(&this->field_0xd0 + (long)p_Var13) +
                      *(int *)(&this->field_0xd4 + (long)p_Var13),iVar2,
                      (uVar4 >> 3) << bVar26 * '\x03',8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          iVar20 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx[-3]);
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          for (iVar24 = 0; iVar24 != iVar2; iVar24 = iVar24 + 1) {
            Mat::channel(&bottom_blob_unpacked,top_blob,iVar24);
            uVar4 = (ulong)*(float *)(&this->field_0xe4 + (long)this->_vptr_Padding_x86_avx[-3]);
            uVar4 = uVar4 << 0x38 | uVar4 << 0x30 | uVar4 << 0x28 |
                    uVar4 << 0x20 | uVar4 << 0x18 | uVar4 << 0x10 | uVar4 << 8 | uVar4;
            iVar5 = iVar24 + iVar20 / -8;
            if (iVar5 < 0 || _c <= iVar5) {
              Mat::fill<long>(&bottom_blob_unpacked,uVar4);
            }
            else {
              Mat::channel(&m,bottom_blob,iVar5);
              pp_Var3 = this->_vptr_Padding_x86_avx;
              p_Var13 = pp_Var3[-3];
              iVar5 = *(int *)(&this->field_0xe0 + (long)p_Var13);
              if (iVar5 == 0) {
                padding_constant_pack8_int8_sse
                          (&m,&bottom_blob_unpacked,*(int *)(&this->field_0xd0 + (long)p_Var13),
                           *(int *)(&this->field_0xd4 + (long)p_Var13),
                           *(int *)(&this->field_0xd8 + (long)p_Var13),
                           *(int *)(&this->field_0xdc + (long)p_Var13),uVar4);
                pp_Var3 = this->_vptr_Padding_x86_avx;
                p_Var13 = pp_Var3[-3];
                iVar5 = *(int *)(&this->field_0xe0 + (long)p_Var13);
              }
              if (iVar5 == 1) {
                iVar5 = *(int *)(&this->field_0xd4 + (long)p_Var13);
                iVar16 = 0;
                iVar6 = *(int *)(&this->field_0xd8 + (long)p_Var13);
                if (*(int *)(&this->field_0xd8 + (long)p_Var13) < 1) {
                  iVar6 = 0;
                }
                iVar17 = m.w;
                if (m.w < 1) {
                  iVar17 = 0;
                }
                iVar12 = *(int *)(&this->field_0xdc + (long)p_Var13);
                if (*(int *)(&this->field_0xdc + (long)p_Var13) < 1) {
                  iVar12 = iVar16;
                }
                puVar15 = (undefined8 *)bottom_blob_unpacked.data;
                iVar8 = *(int *)(&this->field_0xd0 + (long)p_Var13);
                if (*(int *)(&this->field_0xd0 + (long)p_Var13) < 1) {
                  iVar8 = iVar16;
                }
                for (; iVar11 = iVar6, iVar16 != iVar8; iVar16 = iVar16 + 1) {
                  while (iVar11 != 0) {
                    *puVar15 = *m.data;
                    puVar15 = puVar15 + 1;
                    iVar11 = iVar11 + -1;
                  }
                  for (lVar9 = 0; iVar11 = iVar12, iVar17 != (int)lVar9; lVar9 = lVar9 + 1) {
                    *puVar15 = *(undefined8 *)((long)m.data + lVar9 * 8);
                    puVar15 = puVar15 + 1;
                  }
                  while (iVar11 != 0) {
                    *puVar15 = *(undefined8 *)((long)m.data + lVar9 * 8 + -8);
                    puVar15 = puVar15 + 1;
                    iVar11 = iVar11 + -1;
                  }
                }
                iVar17 = 0;
                iVar16 = 0;
                if (0 < m.w) {
                  iVar16 = m.w;
                }
                puVar14 = (undefined8 *)m.data;
                iVar8 = m.h;
                if (m.h < 1) {
                  iVar8 = iVar17;
                }
                for (; iVar11 = iVar6, iVar17 != iVar8; iVar17 = iVar17 + 1) {
                  while (iVar11 != 0) {
                    *puVar15 = *puVar14;
                    puVar15 = puVar15 + 1;
                    iVar11 = iVar11 + -1;
                  }
                  lVar9 = 0;
                  for (lVar23 = 0; iVar16 != (int)lVar23; lVar23 = lVar23 + 1) {
                    puVar15[lVar23] = puVar14[lVar23];
                    lVar9 = lVar9 + -8;
                  }
                  puVar15 = (undefined8 *)((long)puVar15 - lVar9);
                  iVar11 = iVar12;
                  while (bVar26 = iVar11 != 0, iVar11 = iVar11 + -1, bVar26) {
                    *puVar15 = puVar14[lVar23 + -1];
                    puVar15 = puVar15 + 1;
                  }
                  puVar14 = (undefined8 *)((long)puVar14 - lVar9);
                }
                puVar14 = puVar14 + -(long)m.w;
                iVar17 = 0;
                if (iVar5 < 1) {
                  iVar5 = iVar17;
                }
                for (; iVar8 = iVar6, iVar17 != iVar5; iVar17 = iVar17 + 1) {
                  while (iVar8 != 0) {
                    *puVar15 = *puVar14;
                    puVar15 = puVar15 + 1;
                    iVar8 = iVar8 + -1;
                  }
                  for (lVar9 = 0; iVar8 = iVar12, iVar16 != (int)lVar9; lVar9 = lVar9 + 1) {
                    *puVar15 = puVar14[lVar9];
                    puVar15 = puVar15 + 1;
                  }
                  while (iVar8 != 0) {
                    *puVar15 = puVar14[lVar9 + -1];
                    puVar15 = puVar15 + 1;
                    iVar8 = iVar8 + -1;
                  }
                }
                p_Var13 = pp_Var3[-3];
                iVar5 = *(int *)(&this->field_0xe0 + (long)p_Var13);
              }
              if (iVar5 == 2) {
                iVar5 = *(int *)(&this->field_0xd0 + (long)p_Var13);
                iVar6 = *(int *)(&this->field_0xd4 + (long)p_Var13);
                uVar19 = *(uint *)(&this->field_0xd8 + (long)p_Var13);
                lVar9 = (long)(int)uVar19;
                lVar23 = (long)m.w;
                uVar25 = 0;
                uVar4 = 0;
                if (0 < (int)uVar19) {
                  uVar4 = (ulong)uVar19;
                }
                iVar16 = 0;
                if (0 < m.w) {
                  iVar16 = m.w;
                }
                puVar15 = (undefined8 *)((long)m.data + (long)(m.w * iVar5) * 8);
                uVar7 = (ulong)*(uint *)(&this->field_0xdc + (long)p_Var13);
                if ((int)*(uint *)(&this->field_0xdc + (long)p_Var13) < 1) {
                  uVar7 = uVar25;
                }
                iVar17 = iVar5;
                if (iVar5 < 1) {
                  iVar17 = 0;
                }
                lVar21 = (long)(m.w * iVar5) * 8 + lVar9 * 8 + (long)m.data;
                puVar14 = (undefined8 *)bottom_blob_unpacked.data;
                for (; (int)uVar25 != iVar17; uVar25 = (ulong)((int)uVar25 + 1)) {
                  for (lVar22 = 0; -lVar22 != uVar4; lVar22 = lVar22 + -1) {
                    *puVar14 = *(undefined8 *)(lVar21 + lVar22 * 8);
                    puVar14 = puVar14 + 1;
                  }
                  puVar18 = puVar15;
                  for (iVar5 = 0; iVar5 != iVar16; iVar5 = iVar5 + 1) {
                    uVar1 = *puVar18;
                    puVar18 = puVar18 + 1;
                    *puVar14 = uVar1;
                    puVar14 = puVar14 + 1;
                  }
                  for (lVar22 = 0; -lVar22 != uVar7; lVar22 = lVar22 + -1) {
                    *puVar14 = puVar18[lVar22 + -2];
                    puVar14 = puVar14 + 1;
                  }
                  puVar15 = puVar15 + -lVar23;
                  lVar21 = lVar21 + lVar23 * -8;
                }
                iVar17 = 0;
                iVar5 = m.h;
                if (m.h < 1) {
                  iVar5 = iVar17;
                }
                for (; iVar17 != iVar5; iVar17 = iVar17 + 1) {
                  for (lVar21 = 0; -lVar21 != uVar4; lVar21 = lVar21 + -1) {
                    *puVar14 = puVar15[lVar9 + lVar21];
                    puVar14 = puVar14 + 1;
                  }
                  for (iVar12 = 0; iVar12 != iVar16; iVar12 = iVar12 + 1) {
                    uVar1 = *puVar15;
                    puVar15 = puVar15 + 1;
                    *puVar14 = uVar1;
                    puVar14 = puVar14 + 1;
                  }
                  for (lVar21 = 0; -lVar21 != uVar7; lVar21 = lVar21 + -1) {
                    *puVar14 = puVar15[lVar21 + -2];
                    puVar14 = puVar14 + 1;
                  }
                }
                puVar18 = puVar15 + -(long)(m.w * 2);
                iVar5 = 0;
                if (iVar6 < 1) {
                  iVar6 = 0;
                }
                puVar15 = puVar15 + (lVar9 - m.w * 2);
                for (; iVar5 != iVar6; iVar5 = iVar5 + 1) {
                  for (lVar9 = 0; -lVar9 != uVar4; lVar9 = lVar9 + -1) {
                    *puVar14 = puVar15[lVar9];
                    puVar14 = puVar14 + 1;
                  }
                  puVar10 = puVar18;
                  for (iVar17 = 0; iVar17 != iVar16; iVar17 = iVar17 + 1) {
                    uVar1 = *puVar10;
                    puVar10 = puVar10 + 1;
                    *puVar14 = uVar1;
                    puVar14 = puVar14 + 1;
                  }
                  for (lVar9 = 0; -lVar9 != uVar7; lVar9 = lVar9 + -1) {
                    *puVar14 = puVar10[lVar9 + -2];
                    puVar14 = puVar14 + 1;
                  }
                  puVar18 = puVar18 + -lVar23;
                  puVar15 = puVar15 + -lVar23;
                }
              }
              Mat::~Mat(&m);
            }
            Mat::~Mat(&bottom_blob_unpacked);
          }
          return 0;
        }
      }
      break;
    case 4:
      p_Var13 = this->_vptr_Padding_x86_avx[-3];
      if (*(int *)(&this->field_0xe0 + (long)p_Var13) == 0) {
        iVar2 = bottom_blob->d;
        iVar5 = *(int *)(&this->field_0xe8 + (long)p_Var13) + iVar2 +
                *(int *)(&this->field_0xec + (long)p_Var13);
        Mat::create(top_blob,iVar20 + *(int *)(&this->field_0xd8 + (long)p_Var13) +
                             *(int *)(&this->field_0xdc + (long)p_Var13),
                    iVar24 + *(int *)(&this->field_0xd0 + (long)p_Var13) +
                    *(int *)(&this->field_0xd4 + (long)p_Var13),iVar5,_c,uVar4,8,opt->blob_allocator
                   );
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if (iVar5 < 1) {
          iVar5 = 0;
        }
        if (_c < 1) {
          _c = 0;
        }
        for (iVar20 = 0; iVar20 != _c; iVar20 = iVar20 + 1) {
          uVar4 = (ulong)*(float *)(&this->field_0xe4 + (long)this->_vptr_Padding_x86_avx[-3]);
          uVar4 = uVar4 << 0x38 | uVar4 << 0x30 | uVar4 << 0x28 |
                  uVar4 << 0x20 | uVar4 << 0x18 | uVar4 << 0x10 | uVar4 << 8 | uVar4;
          for (iVar24 = 0; iVar5 != iVar24; iVar24 = iVar24 + 1) {
            Mat::channel(&m,top_blob,iVar20);
            Mat::depth(&bottom_blob_unpacked,&m,iVar24);
            Mat::~Mat(&m);
            iVar6 = iVar24 - *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx[-3]);
            if (iVar6 < 0 || iVar2 <= iVar6) {
              Mat::fill<long>(&bottom_blob_unpacked,uVar4);
            }
            else {
              Mat::channel(&local_78,bottom_blob,iVar20);
              Mat::depth(&m,&local_78,
                         iVar24 - *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx[-3]
                                          ));
              Mat::~Mat(&local_78);
              p_Var13 = this->_vptr_Padding_x86_avx[-3];
              padding_constant_pack8_int8_sse
                        (&m,&bottom_blob_unpacked,*(int *)(&this->field_0xd0 + (long)p_Var13),
                         *(int *)(&this->field_0xd4 + (long)p_Var13),
                         *(int *)(&this->field_0xd8 + (long)p_Var13),
                         *(int *)(&this->field_0xdc + (long)p_Var13),uVar4);
              Mat::~Mat(&m);
            }
            Mat::~Mat(&bottom_blob_unpacked);
          }
        }
        return 0;
      }
    }
  }
  Mat::Mat(&bottom_blob_unpacked,bottom_blob);
  if (iVar2 != 1) {
    m.data = *(void **)opt;
    m.elemsize = (size_t)opt->workspace_allocator;
    m.elempack = opt->openmp_blocktime;
    m._28_1_ = opt->use_winograd_convolution;
    m._29_1_ = opt->use_sgemm_convolution;
    m._30_1_ = opt->use_int8_inference;
    m._31_1_ = opt->use_vulkan_compute;
    m.allocator = *(Allocator **)&opt->use_bf16_storage;
    m._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    m._48_8_ = *(undefined8 *)&opt->flush_denormals;
    m._56_8_ = *(undefined8 *)&opt->use_reserved_4;
    m.refcount = (int *)opt->workspace_allocator;
    convert_packing(bottom_blob,&bottom_blob_unpacked,1,(Option *)&m);
  }
  iVar2 = Padding::forward((Padding *)
                           ((long)&this->_vptr_Padding_x86_avx +
                           (long)this->_vptr_Padding_x86_avx[-3]),&bottom_blob_unpacked,top_blob,opt
                          );
  Mat::~Mat(&bottom_blob_unpacked);
  return iVar2;
}

Assistant:

int Padding_x86_avx::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}